

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)24,(moira::Mode)12,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *this_00;
  int *in_RDX;
  StrWriter *in_RSI;
  Moira *in_RDI;
  u32 dst;
  StrWriter *in_stack_ffffffffffffffb8;
  UInt u;
  UInt local_2c;
  int local_28;
  u32 local_20;
  StrWriter *local_10;
  
  local_20 = *in_RDX + 2;
  local_10 = in_RSI;
  uVar1 = dasmRead<(moira::Size)2>(in_RDI,(u32 *)in_stack_ffffffffffffffb8);
  local_20 = (int)(short)uVar1 + local_20;
  this_00 = StrWriter::operator<<(local_10);
  local_28 = (in_RDI->tab).raw;
  StrWriter::operator<<(this_00,(Align)local_28);
  u.raw = (u32)((ulong)in_RDI >> 0x20);
  UInt::UInt(&local_2c,local_20);
  StrWriter::operator<<(in_stack_ffffffffffffffb8,u);
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op)
{
    if (MIMIC_MUSASHI && S == Byte && (u8)op == 0xFF) {
        dasmIllegal(str, addr, op);
        return;
    }

    u32 dst = addr + 2;
    dst += (S == Byte) ? (i8)op : (i16)dasmRead<S>(addr);

    str << Ins<I>{} << tab << UInt(dst);
}